

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_expr.cpp
# Opt level: O3

FDoubleProd * StringToDouble(FProduction *prod)

{
  FDoubleProd *pFVar1;
  double dVar2;
  
  dVar2 = atof((char *)(prod + 1));
  pFVar1 = (FDoubleProd *)
           M_Malloc_Dbg(0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/c_expr.cpp"
                        ,0x151);
  (pFVar1->super_FProduction).Type = PROD_Double;
  pFVar1->Value = dVar2;
  M_Free(prod);
  return pFVar1;
}

Assistant:

static FDoubleProd *StringToDouble (FProduction *prod)
{
	FDoubleProd *newprod;
	
	newprod = NewDoubleProd (atof (static_cast<FStringProd *>(prod)->Value));
	M_Free (prod);
	return newprod;
}